

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

Promise<void> __thiscall
kj::Timer::timeoutAfter<void>(Timer *this,Duration delay,Promise<void> *promise)

{
  PromiseArenaMember *node;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node_00;
  OwnPromiseNode *in_RCX;
  PromiseArenaMember *local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  SourceLocation local_30;
  
  (**(code **)(*delay.value + 0x10))((anon_class_1_0_00000001_for_func *)&local_40);
  Promise<void>::
  then<kj::Timer::timeoutAfter<void>(kj::Quantity<long,kj::_::NanosecondLabel>,kj::Promise<void>&&)::_lambda()_1_>
            ((Promise<void> *)&local_38,(anon_class_1_0_00000001_for_func *)&local_40);
  local_30.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.h";
  local_30.function = "timeoutAfter";
  local_30.lineNumber = 0x9b;
  local_30.columnNumber = 10;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)this,in_RCX,&local_38,&local_30);
  node_00.ptr = local_38.ptr;
  if (&(local_38.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
  }
  node = local_40;
  if (local_40 != (PromiseArenaMember *)0x0) {
    local_40 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Timer::timeoutAfter(Duration delay, Promise<T>&& promise) {
  return promise.exclusiveJoin(afterDelay(delay).then([]() -> kj::Promise<T> {
    return makeTimeoutException();
  }));
}